

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::ExtractDebugVisitor::~ExtractDebugVisitor(ExtractDebugVisitor *this)

{
  pointer ppSVar1;
  
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002acbb8;
  ppSVar1 = (this->stmts_).
            super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->stmts_).
                                  super__Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002ab378;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x60);
  return;
}

Assistant:

void visit(AssignStmt *stmt) override { process_stmt(stmt); }